

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_dispatch_test.cc
# Opt level: O3

void __thiscall ImplDispatchTest::SetUp(ImplDispatchTest *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  
  uVar1 = OPENSSL_get_ia32cap(1);
  this->aesni_ = (bool)((byte)(uVar1 >> 0x19) & 1);
  bVar3 = (bool)((byte)(uVar1 >> 0x16) & 1);
  if ((uVar1 >> 0x1c & 1) == 0) {
    bVar3 = false;
  }
  this->avx_movbe_ = bVar3;
  this->ssse3_ = (bool)((byte)(uVar1 >> 9) & 1);
  uVar1 = OPENSSL_get_ia32cap(3);
  uVar2 = OPENSSL_get_ia32cap(2);
  this->vaes_ = (bool)((byte)uVar2 >> 5 & (~uVar1 & 0x600) == 0);
  this->avx512_ = (bool)((byte)(uVar2 >> 8) & 0xbfffffff < uVar2);
  this->avoid_zmm_ = (bool)((byte)(uVar2 >> 0xe) & 1);
  this->is_x86_64_ = true;
  return;
}

Assistant:

void SetUp() override {
#if defined(OPENSSL_X86) || defined(OPENSSL_X86_64)
    aesni_ = CRYPTO_is_AESNI_capable();
    avx_movbe_ = CRYPTO_is_AVX_capable() && CRYPTO_is_MOVBE_capable();
    ssse3_ = CRYPTO_is_SSSE3_capable();
    vaes_ = CRYPTO_is_VAES_capable() && CRYPTO_is_VPCLMULQDQ_capable() &&
            CRYPTO_is_AVX2_capable();
    avx512_ = CRYPTO_is_AVX512BW_capable() && CRYPTO_is_AVX512VL_capable() &&
              CRYPTO_is_BMI2_capable();
    avoid_zmm_ = CRYPTO_cpu_avoid_zmm_registers();
    is_x86_64_ =
#if defined(OPENSSL_X86_64)
        true;
#else
        false;
#endif
#endif  // X86 || X86_64
  }